

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

Type __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
PushBack<long>(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *this,long value,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  ushort uVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar2;
  Data local_10;
  
  local_10.s.str = (Ch *)0x96000000000000;
  if (value < 0) {
    uVar1 = 0xb6;
    if ((ulong)value < 0xffffffff80000000) goto LAB_0015be1d;
  }
  else {
    uVar1 = 0x1f6;
    if ((value & 0xffffffff80000000U) != 0) {
      uVar1 = (ushort)((ulong)value >> 0x20 == 0) << 6 | 0x196;
    }
  }
  local_10.s.str = (Ch *)((ulong)uVar1 << 0x30);
LAB_0015be1d:
  local_10.n = (Number)value;
  pGVar2 = PushBack(this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_10.s,allocator);
  return pGVar2;
}

Assistant:

PushBack(T value, Allocator& allocator) {
        GenericValue v(value);
        return PushBack(v, allocator);
    }